

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O1

char * al_get_default_shader_source(ALLEGRO_SHADER_PLATFORM platform,ALLEGRO_SHADER_TYPE type)

{
  ALLEGRO_SHADER_PLATFORM AVar1;
  char *pcVar2;
  char *pcVar3;
  
  AVar1 = resolve_platform(platform);
  pcVar3 = 
  "#ifdef GL_ES\nprecision lowp float;\n#endif\nuniform sampler2D al_tex;\nuniform bool al_use_tex;\nuniform bool al_alpha_test;\nuniform int al_alpha_func;\nuniform float al_alpha_test_val;\nvarying vec4 varying_color;\nvarying vec2 varying_texcoord;\n\nbool alpha_test_func(float x, int op, float compare);\n\nvoid main()\n{\n  vec4 c;\n  if (al_use_tex)\n    c = varying_color * texture2D(al_tex, varying_texcoord);\n  else\n    c = varying_color;\n  if (!al_alpha_test || alpha_test_func(c.a, al_alpha_func, al_alpha_test_val))\n    gl_FragColor = c;\n  else\n    discard;\n}\n\nbool alpha_test_func(float x, int op, float compare)\n{\n  if (op == 0) return false;\n  else if (op == 1) return true;\n  else if (op == 2) return x < compare;\n  else if (op == 3) return x == compare;\n  else if (op == 4) return x <= compare;\n  else if (op == 5) return x > compare;\n  else if (op == 6) return x != compare;\n  else if (op == 7) return x >= compare;\n  return false;\n}\n"
  ;
  if (type != ALLEGRO_PIXEL_SHADER) {
    pcVar3 = (char *)0x0;
  }
  pcVar2 = 
  "attribute vec4 al_pos;\nattribute vec4 al_color;\nattribute vec2 al_texcoord;\nuniform mat4 al_projview_matrix;\nuniform bool al_use_tex_matrix;\nuniform mat4 al_tex_matrix;\nvarying vec4 varying_color;\nvarying vec2 varying_texcoord;\nvoid main()\n{\n  varying_color = al_color;\n  if (al_use_tex_matrix) {\n    vec4 uv = al_tex_matrix * vec4(al_texcoord, 0, 1);\n    varying_texcoord = vec2(uv.x, uv.y);\n  }\n  else\n    varying_texcoord = al_texcoord;\n  gl_Position = al_projview_matrix * al_pos;\n}\n"
  ;
  if (type != ALLEGRO_VERTEX_SHADER) {
    pcVar2 = pcVar3;
  }
  if (AVar1 != ALLEGRO_SHADER_GLSL) {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char const *al_get_default_shader_source(ALLEGRO_SHADER_PLATFORM platform,
   ALLEGRO_SHADER_TYPE type)
{
   (void)type;
   switch (resolve_platform(platform)) {
      case ALLEGRO_SHADER_GLSL:
#ifdef ALLEGRO_CFG_SHADER_GLSL
         switch (type) {
            case ALLEGRO_VERTEX_SHADER:
               return default_glsl_vertex_source;
            case ALLEGRO_PIXEL_SHADER:
               return default_glsl_pixel_source;
         }
#endif
         break;

      case ALLEGRO_SHADER_HLSL:
#ifdef ALLEGRO_CFG_SHADER_HLSL
         switch (type) {
            case ALLEGRO_VERTEX_SHADER:
               return default_hlsl_vertex_source;
            case ALLEGRO_PIXEL_SHADER:
               return default_hlsl_pixel_source;
         }
#endif
         break;

      case ALLEGRO_SHADER_AUTO:
         ASSERT(0);
   }
   return NULL;
}